

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

Result wabt::ResolveNamesModule(Module *module,Errors *errors)

{
  Result RVar1;
  undefined1 local_b0 [8];
  NameResolver resolver;
  
  anon_unknown_13::NameResolver::NameResolver((NameResolver *)local_b0,(Script *)0x0,errors);
  RVar1 = anon_unknown_13::NameResolver::VisitModule((NameResolver *)local_b0,module);
  anon_unknown_13::NameResolver::~NameResolver((NameResolver *)local_b0);
  return (Result)RVar1.enum_;
}

Assistant:

Result ResolveNamesModule(Module* module, Errors* errors) {
  NameResolver resolver(nullptr, errors);
  return resolver.VisitModule(module);
}